

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

void tcache_arena_dissociate(tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache)

{
  uint64_t uVar1;
  malloc_mutex_t *in_RDX;
  tsdn_t *in_RSI;
  arena_t *in_RDI;
  tcache_t *unaff_retaddr;
  arena_t *arena;
  
  uVar1 = *(uint64_t *)((long)&in_RSI->tsd + 0x28);
  malloc_mutex_lock((tsdn_t *)in_RDI,(malloc_mutex_t *)in_RSI);
  if (*(tsdn_t **)(uVar1 + 0x28a8) == in_RSI) {
    *(undefined8 *)(uVar1 + 0x28a8) = *(undefined8 *)*(long *)(uVar1 + 0x28a8);
  }
  if (*(tsdn_t **)(uVar1 + 0x28a8) == in_RSI) {
    *(undefined8 *)(uVar1 + 0x28a8) = 0;
  }
  else {
    **(undefined8 **)((long)&in_RSI->tsd + 8) =
         *(undefined8 *)
          ((((anon_union_112_3_be06638a_for_malloc_mutex_s_0 *)&in_RSI->tsd)->witness).name + 8);
    *(uint64_t *)
     ((((anon_union_112_3_be06638a_for_malloc_mutex_s_0 *)&in_RSI->tsd)->witness).name + 8) =
         *(uint64_t *)((long)&in_RSI->tsd + 8);
    *(uint64_t *)((long)&in_RSI->tsd + 8) = **(uint64_t **)((long)&in_RSI->tsd + 8);
    **(uint64_t **)
      ((((anon_union_112_3_be06638a_for_malloc_mutex_s_0 *)&in_RSI->tsd)->witness).name + 8) =
         (((anon_union_112_3_be06638a_for_malloc_mutex_s_0 *)&in_RSI->tsd)->field_0).prof_data.
         tot_wait_time.ns;
    **(undefined8 **)((long)&in_RSI->tsd + 8) = in_RSI;
  }
  if ((uint64_t *)*(undefined1 **)(uVar1 + 0x28b0) == (uint64_t *)((long)&in_RSI->tsd + 0x10U)) {
    *(undefined8 *)(uVar1 + 0x28b0) = **(undefined8 **)(uVar1 + 0x28b0);
  }
  if ((uint64_t *)*(undefined1 **)(uVar1 + 0x28b0) == (uint64_t *)((long)&in_RSI->tsd + 0x10U)) {
    *(undefined8 *)(uVar1 + 0x28b0) = 0;
  }
  else {
    **(undefined8 **)((long)&in_RSI->tsd + 0x18) =
         *(undefined8 *)(*(uint64_t *)((long)&in_RSI->tsd + 0x10) + 8);
    *(uint64_t *)(*(uint64_t *)((long)&in_RSI->tsd + 0x10) + 8) =
         *(uint64_t *)((long)&in_RSI->tsd + 0x18);
    *(uint64_t *)((long)&in_RSI->tsd + 0x18) = **(uint64_t **)((long)&in_RSI->tsd + 0x18);
    **(uint64_t **)(*(uint64_t *)((long)&in_RSI->tsd + 0x10) + 8) =
         *(uint64_t *)((long)&in_RSI->tsd + 0x10);
    **(long **)((long)&in_RSI->tsd + 0x18) = (long)((long)&in_RSI->tsd + 0x10);
  }
  duckdb_je_tcache_stats_merge((tsdn_t *)arena,unaff_retaddr,in_RDI);
  malloc_mutex_unlock(in_RSI,in_RDX);
  *(uint64_t *)((long)&in_RSI->tsd + 0x28) = 0;
  return;
}

Assistant:

static void
tcache_arena_dissociate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache) {
	arena_t *arena = tcache_slow->arena;
	assert(arena != NULL);
	if (config_stats) {
		/* Unlink from list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
		if (config_debug) {
			bool in_ql = false;
			tcache_slow_t *iter;
			ql_foreach(iter, &arena->tcache_ql, link) {
				if (iter == tcache_slow) {
					in_ql = true;
					break;
				}
			}
			assert(in_ql);
		}
		ql_remove(&arena->tcache_ql, tcache_slow, link);
		ql_remove(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);
		tcache_stats_merge(tsdn, tcache_slow->tcache, arena);
		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
	tcache_slow->arena = NULL;
}